

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_append2_op(sexp ctx,sexp self,sexp_sint_t n,sexp a,sexp b)

{
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX_00;
  sexp self_00;
  sexp b1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [40];
  
  self_00 = (sexp)&local_48;
  local_38._16_8_ = &local_48;
  local_38._0_8_ = local_40;
  local_40 = (undefined1  [8])0x43e;
  local_38._24_8_ = local_40 + 8;
  local_38._8_8_ = (ctx->value).context.saves;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_38._24_8_;
  (ctx->value).context.saves = (sexp_gc_var_t *)(local_38 + 0x10);
  local_48 = b;
  local_40 = (undefined1  [8])sexp_reverse_op(ctx,(sexp)&local_48,local_38._24_8_,a);
  n_00 = extraout_RDX;
  for (; (((ulong)local_40 & 3) == 0 && (((sexp)local_40)->tag == 6));
      local_40 = (undefined1  [8])
                 (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_40 + 8))->type).cpl) {
    local_48 = sexp_cons_op(ctx,self_00,n_00,(((sexp)local_40)->value).type.name,local_48);
    n_00 = extraout_RDX_00;
  }
  (ctx->value).context.saves = (sexp_gc_var_t *)local_38._8_8_;
  return local_48;
}

Assistant:

sexp sexp_append2_op (sexp ctx, sexp self, sexp_sint_t n, sexp a, sexp b) {
  sexp_gc_var2(a1, b1);
  sexp_gc_preserve2(ctx, a1, b1);
  b1 = b;
  for (a1=sexp_reverse(ctx, a); sexp_pairp(a1); a1=sexp_cdr(a1))
    b1 = sexp_cons(ctx, sexp_car(a1), b1);
  sexp_gc_release2(ctx);
  return b1;
}